

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
          (SourceLocationCommentPrinter *this,string *output)

{
  ulong uVar1;
  size_type sVar2;
  string *in_RSI;
  byte *in_RDI;
  int i;
  string *in_stack_00000200;
  SourceLocationCommentPrinter *in_stack_00000208;
  string local_68 [48];
  string local_38 [36];
  int local_14;
  string *local_10;
  
  if ((*in_RDI & 1) != 0) {
    local_10 = in_RSI;
    for (local_14 = 0; uVar1 = (ulong)local_14,
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x58)), uVar1 < sVar2; local_14 = local_14 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x58),(long)local_14);
      FormatComment(in_stack_00000208,in_stack_00000200);
      std::__cxx11::string::operator+=(local_10,local_38);
      std::__cxx11::string::~string(local_38);
      std::__cxx11::string::operator+=(local_10,"\n");
    }
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      FormatComment(in_stack_00000208,in_stack_00000200);
      std::__cxx11::string::operator+=(local_10,local_68);
      std::__cxx11::string::~string(local_68);
    }
  }
  return;
}

Assistant:

void AddPreComment(std::string* output) {
    if (have_source_loc_) {
      // Detached leading comments.
      for (int i = 0; i < source_loc_.leading_detached_comments.size(); ++i) {
        *output += FormatComment(source_loc_.leading_detached_comments[i]);
        *output += "\n";
      }
      // Attached leading comments.
      if (!source_loc_.leading_comments.empty()) {
        *output += FormatComment(source_loc_.leading_comments);
      }
    }
  }